

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cc
# Opt level: O2

bool __thiscall mp::internal::SolverAppOptionParser::ShowUsage(SolverAppOptionParser *this)

{
  pointer pOVar1;
  pointer args;
  pointer local_28;
  
  local_28 = (this->solver_->name_)._M_dataplus._M_p;
  BasicSolver::Print<char_const*>(this->solver_,(CStringRef)0x2c06e3,&local_28);
  BasicSolver::Print<>(this->solver_,(CStringRef)0x2c0718);
  pOVar1 = (this->options_).options_.super__Vector_base<mp::Option,_std::allocator<mp::Option>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (args = (this->options_).options_.super__Vector_base<mp::Option,_std::allocator<mp::Option>_>.
              _M_impl.super__Vector_impl_data._M_start; args != pOVar1; args = args + 1) {
    BasicSolver::Print<char,char_const*>
              (this->solver_,(CStringRef)0x2c0723,&args->name,&args->description);
  }
  return false;
}

Assistant:

bool SolverAppOptionParser::ShowUsage() {
  solver_.Print("usage: {} [options] stub [-AMPL] [<assignment> ...]\n",
                solver_.name());
  solver_.Print("\nOptions:\n");
  for (OptionList::iterator
       i = options_.begin(), end = options_.end(); i != end; ++i) {
    solver_.Print("\t-{}  {}\n", i->name, i->description);
  }
  return false;
}